

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

TValue * index2adr_stack(lua_State *L,int idx)

{
  TValue *o;
  int idx_local;
  lua_State *L_local;
  
  if (idx < 1) {
    L_local = (lua_State *)(L->top + idx);
  }
  else {
    L_local = (lua_State *)(L->base + (idx + -1));
    if (L->top <= L_local) {
      L_local = (lua_State *)((L->glref).ptr64 + 0xf8);
    }
  }
  return (TValue *)L_local;
}

Assistant:

static TValue *index2adr_stack(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    if (o < L->top) {
      return o;
    } else {
      lj_checkapi(0, "invalid stack slot %d", idx);
      return niltv(L);
    }
    return o < L->top ? o : niltv(L);
  } else {
    lj_checkapi(idx != 0 && -idx <= L->top - L->base,
		"invalid stack slot %d", idx);
    return L->top + idx;
  }
}